

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_remove(Context *context,IntrinsicResult partialResult)

{
  bool bVar1;
  int32_t iVar2;
  long startPos;
  String *pSVar3;
  _func_int *p_Var4;
  long max;
  long numBytes;
  code *min;
  _func_int *i;
  Value *this;
  Value self;
  ValueDict selfMap;
  Value k;
  Value local_d8;
  String substr;
  String local_b8;
  String local_a8;
  String local_98;
  String local_88;
  String local_78;
  String local_68;
  Value local_58;
  String local_48;
  Value local_38;
  Value local_28;
  
  String::String(&local_48,"self");
  Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  String::~String(&local_48);
  String::String(&local_78,"k");
  Context::GetVar((Context *)&k,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  String::~String(&local_78);
  if (self.type == Null) {
    String::String(&local_88,"argument to \'remove\' must not be null");
    pSVar3 = &local_88;
    RuntimeException::RuntimeException((RuntimeException *)&selfMap,pSVar3);
    RuntimeException::raise((RuntimeException *)&selfMap,(int)pSVar3);
    MiniscriptException::~MiniscriptException((MiniscriptException *)&selfMap);
    String::~String(&local_88);
  }
  if (self.type == String) {
    if (k.type == Null) {
      String::String(&local_a8,"argument to \'remove\' must not be null");
      pSVar3 = &local_a8;
      RuntimeException::RuntimeException((RuntimeException *)&selfMap,pSVar3);
      RuntimeException::raise((RuntimeException *)&selfMap,(int)pSVar3);
      MiniscriptException::~MiniscriptException((MiniscriptException *)&selfMap);
      String::~String(&local_a8);
    }
    Value::GetString((Value *)&selfMap);
    Value::ToString((Value *)&substr,(Machine *)&k);
    startPos = String::IndexOfB((String *)&selfMap,&substr,0);
    if (startPos < 0) {
      local_d8.type = self.type;
      local_d8.noInvoke = self.noInvoke;
      local_d8.localOnly = self.localOnly;
      local_d8.data = self.data;
      if (self.data.ref != (RefCountedStorage *)0x0 && Temp < self.type) {
        (self.data.ref)->refCount = (self.data.ref)->refCount + 1;
      }
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_d8,true);
      Value::~Value(&local_d8);
    }
    else {
      if (substr.ss == (StringStorage *)0x0) {
        numBytes = 0;
      }
      else {
        numBytes = (substr.ss)->dataSize - 1;
      }
      local_68.ss = (StringStorage *)0x0;
      local_68.isTemp = false;
      pSVar3 = String::ReplaceB((String *)&selfMap,startPos,numBytes,&local_68);
      Value::Value(&local_58,pSVar3);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
      Value::~Value(&local_58);
      String::~String(&local_68);
    }
    String::~String(&substr);
    String::~String((String *)&selfMap);
  }
  else if (self.type == List) {
    if (k.type == Null) {
      String::String(&local_98,"argument to \'remove\' must not be null");
      pSVar3 = &local_98;
      RuntimeException::RuntimeException((RuntimeException *)&selfMap,pSVar3);
      RuntimeException::raise((RuntimeException *)&selfMap,(int)pSVar3);
      MiniscriptException::~MiniscriptException((MiniscriptException *)&selfMap);
      String::~String(&local_98);
    }
    Value::GetList((Value *)&selfMap);
    iVar2 = Value::IntValue(&k);
    i = (_func_int *)(long)iVar2;
    if (iVar2 < 0) {
      if (selfMap._vptr_Dictionary == (_func_int **)0x0) {
        p_Var4 = (_func_int *)0x0;
      }
      else {
        p_Var4 = selfMap._vptr_Dictionary[4];
      }
      i = i + (long)p_Var4;
    }
    if (selfMap._vptr_Dictionary == (_func_int **)0x0) {
      min = (code *)0xffffffffffffffff;
    }
    else {
      min = selfMap._vptr_Dictionary[4] + -1;
    }
    CheckRange((long)i,(long)min,max);
    List<MiniScript::Value>::RemoveAt((List<MiniScript::Value> *)&selfMap,(long)i);
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
    List<MiniScript::Value>::release((List<MiniScript::Value> *)&selfMap);
  }
  else if (self.type == Map) {
    Value::GetDict(&selfMap,&self);
    bVar1 = Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::ContainsKey
                      (&selfMap,&k);
    if (bVar1) {
      Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Remove
                (&selfMap,&k,(Value *)0x0);
      this = &local_28;
      Value::Value(this,(Value *)Value::one);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    else {
      this = &local_38;
      Value::Value(this,(Value *)Value::zero);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,this,true);
    }
    Value::~Value(this);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary(&selfMap);
  }
  else {
    String::String(&local_b8,"Type Error: \'remove\' requires map, list, or string");
    pSVar3 = &local_b8;
    TypeException::TypeException((TypeException *)&selfMap,pSVar3);
    TypeException::raise((TypeException *)&selfMap,(int)pSVar3);
    MiniscriptException::~MiniscriptException((MiniscriptException *)&selfMap);
    String::~String(&local_b8);
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
  }
  Value::~Value(&k);
  Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value k = context->GetVar("k");
		if (self.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
		if (self.type == ValueType::Map) {
			ValueDict selfMap = self.GetDict();
			if (selfMap.ContainsKey(k)) {
				selfMap.Remove(k);
				return IntrinsicResult(Value::one);
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::List) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			ValueList selfList = self.GetList();
			long idx = k.IntValue();
			if (idx < 0) idx += selfList.Count();
			CheckRange(idx, 0, selfList.Count()-1);
			selfList.RemoveAt(idx);
			return IntrinsicResult::Null;
		} else if (self.type == ValueType::String) {
			if (k.IsNull()) RuntimeException("argument to 'remove' must not be null").raise();
			String selfStr = self.GetString();
			String substr = k.ToString();
			long foundPosB = selfStr.IndexOfB(substr);
			if (foundPosB < 0) return IntrinsicResult(self);
			return IntrinsicResult(selfStr.ReplaceB(foundPosB, substr.LengthB(), String()));
		}
		TypeException("Type Error: 'remove' requires map, list, or string").raise();
		return IntrinsicResult::Null;
	}